

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmi2mid.cc
# Opt level: O1

size_t xmi_process_INFO(PBuffer *buffer,MidiFile *param_2)

{
  undefined2 uVar1;
  element_type *peVar2;
  long lVar3;
  Stream *this;
  undefined1 *puVar4;
  _Alloc_hider _Var5;
  anon_union_2_2_7f9ed247 source;
  anon_union_2_2_7f9ed247 dest;
  undefined1 local_70 [16];
  _Alloc_hider local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  peVar2 = (buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2->size == 2) {
    uVar1 = *(undefined2 *)peVar2->read;
    peVar2->read = peVar2->read + 2;
    if (peVar2->endianess == EndianessBig) {
      local_70._0_2_ = uVar1;
      lVar3 = 1;
      puVar4 = local_70 + 0xe;
      do {
        *puVar4 = local_70[lVar3];
        puVar4 = puVar4 + 1;
        lVar3 = lVar3 + -1;
      } while (lVar3 == 0);
    }
    local_60._M_p = (pointer)&local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"xmi2mid","");
    Log::Logger::operator[]((Logger *)local_70,(string *)&Log::Verbose);
    this = Log::Stream::operator<<((Stream *)local_70,"\tXMI contains ");
    std::ostream::_M_insert<unsigned_long>((ulong)this->stream);
    Log::Stream::operator<<(this," track(s)");
    Log::Stream::~Stream((Stream *)local_70);
    local_30._M_allocated_capacity = local_50._M_allocated_capacity;
    _Var5._M_p = local_60._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_p == &local_50) goto LAB_00139a2f;
  }
  else {
    local_40[0] = &local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"xmi2mid","");
    Log::Logger::operator[]((Logger *)local_70,(string *)&Log::Debug);
    Log::Stream::operator<<((Stream *)local_70,"\tInconsistent INFO block.");
    Log::Stream::~Stream((Stream *)local_70);
    _Var5._M_p = (pointer)local_40[0];
    if (local_40[0] == &local_30) goto LAB_00139a2f;
  }
  operator_delete(_Var5._M_p,local_30._M_allocated_capacity + 1);
LAB_00139a2f:
  return ((buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->size;
}

Assistant:

static size_t
xmi_process_INFO(PBuffer buffer, MidiFile * /*midi*/) {
  if (buffer->get_size() != 2) {
    Log::Debug["xmi2mid"] << "\tInconsistent INFO block.";
  } else {
    uint16_t track_count = buffer->pop<uint16_t>();
    Log::Verbose["xmi2mid"] << "\tXMI contains " << track_count << " track(s)";
  }
  return buffer->get_size();
}